

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  FieldDescriptor *pFVar1;
  long *plVar2;
  byte bVar3;
  Extension *pEVar4;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  RepeatedField<long> *this_02;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<bool> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<float> *this_06;
  string *this_07;
  Arena *pAVar6;
  Type *pTVar7;
  uint64 uVar8;
  __pointer_type pSVar9;
  int i;
  long lVar10;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar11;
  undefined1 auVar12 [16];
  string local_50;
  
  if (other_extension->is_repeated == true) {
    pFVar1 = other_extension->descriptor;
    pVar11 = Insert(this,number);
    pEVar4 = pVar11.first;
    pEVar4->descriptor = pFVar1;
    bVar3 = other_extension->type;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar4->type = bVar3;
      pEVar4->is_packed = other_extension->is_packed;
      pEVar4->is_repeated = true;
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar3 * 4)) {
    case 1:
    case 8:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_00 = (pEVar4->field_0).repeated_int32_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_00 = (RepeatedField<int> *)operator_new(0x10);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          this_00 = (RepeatedField<int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<int>>);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00;
      }
      RepeatedField<int>::MergeFrom(this_00,(other_extension->field_0).repeated_int32_value);
      return;
    case 2:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_02 = (pEVar4->field_0).repeated_int64_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_02 = (RepeatedField<long> *)operator_new(0x10);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<long>::typeinfo,0x10);
          this_02 = (RepeatedField<long> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<long>>);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_02;
      }
      RepeatedField<long>::MergeFrom(this_02,(other_extension->field_0).repeated_int64_value);
      return;
    case 3:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_03 = (pEVar4->field_0).repeated_uint32_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_03 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
          this_03 = (RepeatedField<unsigned_int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>)
          ;
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_03;
      }
      RepeatedField<unsigned_int>::MergeFrom
                (this_03,(other_extension->field_0).repeated_uint32_value);
      return;
    case 4:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_01 = (pEVar4->field_0).repeated_uint64_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_01 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          this_01->current_size_ = 0;
          this_01->total_size_ = 0;
          this_01->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
          this_01 = (RepeatedField<unsigned_long> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>
                              );
          this_01->current_size_ = 0;
          this_01->total_size_ = 0;
          this_01->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01;
      }
      RepeatedField<unsigned_long>::MergeFrom
                (this_01,(other_extension->field_0).repeated_uint64_value);
      return;
    case 5:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_05 = (pEVar4->field_0).repeated_double_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_05 = (RepeatedField<double> *)operator_new(0x10);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          this_05 = (RepeatedField<double> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<double>>);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_05;
      }
      RepeatedField<double>::MergeFrom(this_05,(other_extension->field_0).repeated_double_value);
      return;
    case 6:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_06 = (pEVar4->field_0).repeated_float_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_06 = (RepeatedField<float> *)operator_new(0x10);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<float>::typeinfo,0x10);
          this_06 = (RepeatedField<float> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<float>>);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_06;
      }
      RepeatedField<float>::MergeFrom(this_06,(other_extension->field_0).repeated_float_value);
      return;
    case 7:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_04 = (pEVar4->field_0).repeated_bool_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_04 = (RepeatedField<bool> *)operator_new(0x10);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
          this_04 = (RepeatedField<bool> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<bool>>);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = pAVar6;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_04;
      }
      RepeatedField<bool>::MergeFrom(this_04,(other_extension->field_0).repeated_bool_value);
      return;
    case 9:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_07 = (pEVar4->field_0).string_value;
      }
      else {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          this_07 = (string *)operator_new(0x18);
          (this_07->_M_dataplus)._M_p = (pointer)0x0;
          this_07->_M_string_length = 0;
          (this_07->field_2)._M_allocated_capacity = 0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,
                           0x18);
          this_07 = (string *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar6->impl_,0x18,
                               arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                              );
          (this_07->_M_dataplus)._M_p = (pointer)pAVar6;
          this_07->_M_string_length = 0;
          (this_07->field_2)._M_allocated_capacity = 0;
        }
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_07;
      }
      RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)this_07,
                 (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
      return;
    case 10:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pAVar6 = this->arena_;
        if (pAVar6 == (Arena *)0x0) {
          pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
          (pRVar5->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
          (pRVar5->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar5->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar5->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        else {
          Arena::AllocHook(pAVar6,(type_info *)
                                  &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
          pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ArenaImpl::AllocateAlignedAndAddCleanup
                                (&pAVar6->impl_,0x18,
                                 arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                                );
          (pRVar5->super_RepeatedPtrFieldBase).arena_ = pAVar6;
          (pRVar5->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar5->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar5->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        (pEVar4->field_0).repeated_string_value = pRVar5;
      }
      pRVar5 = (other_extension->field_0).repeated_string_value;
      for (lVar10 = 0; lVar10 < (pRVar5->super_RepeatedPtrFieldBase).current_size_;
          lVar10 = lVar10 + 1) {
        plVar2 = (long *)((pRVar5->super_RepeatedPtrFieldBase).rep_)->elements[lVar10];
        pTVar7 = RepeatedPtrFieldBase::
                 AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           ((RepeatedPtrFieldBase *)(pEVar4->field_0).string_value);
        if (pTVar7 == (Type *)0x0) {
          pTVar7 = (Type *)(**(code **)(*plVar2 + 0x20))(plVar2,this->arena_);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)(pEVar4->field_0).int64_value,pTVar7);
        }
        (*pTVar7->_vptr_MessageLite[10])(pTVar7,plVar2);
      }
      return;
    default:
      return;
    }
  }
  if ((other_extension->field_0xa & 1) != 0) {
    return;
  }
  bVar3 = other_extension->type;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar3 * 4)) {
  case 1:
    SetInt32(this,number,bVar3,(other_extension->field_0).int32_value,other_extension->descriptor);
    return;
  case 2:
    SetInt64(this,number,bVar3,(other_extension->field_0).int64_value,other_extension->descriptor);
    return;
  case 3:
    SetUInt32(this,number,bVar3,(other_extension->field_0).uint32_value,other_extension->descriptor)
    ;
    return;
  case 4:
    SetUInt64(this,number,bVar3,(other_extension->field_0).uint64_value,other_extension->descriptor)
    ;
    return;
  case 5:
    SetDouble(this,number,bVar3,(other_extension->field_0).double_value,other_extension->descriptor)
    ;
    return;
  case 6:
    SetFloat(this,number,bVar3,(other_extension->field_0).float_value,other_extension->descriptor);
    return;
  case 7:
    SetBool(this,number,bVar3,(other_extension->field_0).bool_value,other_extension->descriptor);
    return;
  case 8:
    SetEnum(this,number,bVar3,(other_extension->field_0).enum_value,other_extension->descriptor);
    return;
  case 9:
    std::__cxx11::string::string
              ((string *)&local_50,(string *)(other_extension->field_0).string_value);
    SetString(this,number,bVar3,&local_50,other_extension->descriptor);
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case 10:
    pFVar1 = other_extension->descriptor;
    pVar11 = Insert(this,number);
    pEVar4 = pVar11.first;
    pEVar4->descriptor = pFVar1;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pAVar6 = (Arena *)(pEVar4->field_0).repeated_string_value;
      pRVar5 = (other_extension->field_0).repeated_string_value;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pSVar9 = (pAVar6->impl_).threads_._M_b._M_p;
        if ((pEVar4->field_0xa & 0x10) != 0) {
          pAVar6 = (Arena *)(*(code *)pSVar9->next_)();
          goto LAB_0028c69a;
        }
        (*(code *)pSVar9[1].owner_)(pAVar6,(size_t)pRVar5);
      }
      else {
        if ((pEVar4->field_0xa & 0x10) == 0) {
          uVar8 = (*(code *)(((pRVar5->super_RepeatedPtrFieldBase).arena_)->impl_).initial_block_)
                            (pRVar5,pAVar6);
          pSVar9 = (pAVar6->impl_).threads_._M_b._M_p;
          goto LAB_0028c6a3;
        }
        (*(code *)(pAVar6->impl_).threads_._M_b._M_p[1].next_)(pAVar6,pRVar5,pVar11._8_8_);
      }
    }
    else {
      pEVar4->type = other_extension->type;
      pEVar4->is_packed = other_extension->is_packed;
      pEVar4->is_repeated = false;
      bVar3 = pEVar4->field_0xa & 0xf;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pEVar4->field_0xa = bVar3;
        pAVar6 = (Arena *)(*(code *)(((((other_extension->field_0).repeated_string_value)->
                                      super_RepeatedPtrFieldBase).arena_)->impl_).lifecycle_id_)
                                    ((other_extension->field_0).repeated_string_value,this->arena_);
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pAVar6;
LAB_0028c69a:
        uVar8 = (other_extension->field_0).uint64_value;
        pSVar9 = (pAVar6->impl_).threads_._M_b._M_p;
LAB_0028c6a3:
        (*(code *)pSVar9[1].owner_)(pAVar6,uVar8);
      }
      else {
        pEVar4->field_0xa = bVar3 | 0x10;
        auVar12 = (*(code *)(((((other_extension->field_0).repeated_string_value)->
                              super_RepeatedPtrFieldBase).arena_)->impl_).space_allocated_.
                            super___atomic_base<unsigned_long>._M_i)
                            ((other_extension->field_0).repeated_string_value,this->arena_);
        pAVar6 = auVar12._0_8_;
        (pEVar4->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pAVar6;
        (*(code *)(pAVar6->impl_).threads_._M_b._M_p[1].next_)
                  (pAVar6,(other_extension->field_0).string_value,auVar12._8_8_);
      }
    }
    pEVar4->field_0xa = pEVar4->field_0xa & 0xf0;
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}